

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O2

flag_type __thiscall
stored_flags<setup::(anonymous_namespace)::stored_architectures_1,_32UL>::get
          (stored_flags<setup::(anonymous_namespace)::stored_architectures_1,_32UL> *this)

{
  logger *plVar1;
  ulong uVar2;
  enum_type *peVar3;
  ostringstream *poVar4;
  size_t i;
  ulong uVar5;
  flag_type result;
  logger local_1b0;
  
  uVar2 = (ulong)(this->super_stored_bitfield<5UL,_32UL>).bits[0];
  result._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
  peVar3 = &setup::(anonymous_namespace)::stored_architectures_1::values;
  for (uVar5 = 0; uVar5 != 5; uVar5 = uVar5 + 1) {
    if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
      flags<setup::header::architecture_types_Enum_,_6UL>::operator|=(&result,*peVar3);
      uVar2 = uVar2 & ~(1L << ((byte)uVar5 & 0x3f));
    }
    peVar3 = peVar3 + 1;
  }
  if (uVar2 != 0) {
    local_1b0.level = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
    std::operator<<((ostream *)&local_1b0.buffer,"Unexpected ");
    plVar1 = logger::operator<<(&local_1b0,
                                &enum_names<setup::header::architecture_types_Enum_>::name);
    poVar4 = &plVar1->buffer;
    std::operator<<((ostream *)poVar4," flags: ");
    *(uint *)(&plVar1->field_0x20 + *(long *)(*(long *)poVar4 + -0x18)) =
         *(uint *)(&plVar1->field_0x20 + *(long *)(*(long *)poVar4 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    *(uint *)(&plVar1->field_0x20 + *(long *)(*(long *)poVar4 + -0x18)) =
         *(uint *)(&plVar1->field_0x20 + *(long *)(*(long *)poVar4 + -0x18)) & 0xffffffb5 | 2;
    logger::~logger(&local_1b0);
  }
  return (flag_type)(flag_type)result._flags.super__Base_bitset<1UL>._M_w;
}

Assistant:

boost::uint64_t lower_bits() const {
		
		BOOST_STATIC_ASSERT(sizeof(boost::uint64_t) % sizeof(base_type) == 0);
		
		boost::uint64_t result = 0;
		
		for(size_t i = 0; i < std::min(sizeof(boost::uint64_t) / sizeof(base_type), size_t(count)); i++) {
			result |= (boost::uint64_t(bits[i]) << (i * base_size));
		}
		
		return result;
	}